

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O0

void redraw_GL(SWindowData *window_data,void *pixels)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  float vertices [16];
  float h;
  float w;
  float y;
  float x;
  GLenum format;
  SWindowData_X11 *window_data_ex;
  float local_78;
  float local_74;
  undefined4 local_70;
  undefined4 local_6c;
  float local_68;
  float local_64;
  undefined4 local_60;
  undefined4 local_5c;
  float local_58;
  float local_54;
  undefined4 local_50;
  undefined4 local_4c;
  float local_48;
  float local_44;
  undefined4 local_40;
  undefined4 local_3c;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  local_18 = (undefined8 *)*in_RDI;
  local_1c = 0x80e1;
  local_78 = (float)*(uint *)(in_RDI + 10);
  local_74 = (float)*(uint *)((long)in_RDI + 0x54);
  local_68 = (float)*(uint *)(in_RDI + 10) + (float)*(uint *)(in_RDI + 0xb);
  local_54 = (float)*(uint *)((long)in_RDI + 0x54) + (float)*(uint *)((long)in_RDI + 0x5c);
  local_70 = 0;
  local_6c = 0;
  local_60 = 0x3f800000;
  local_5c = 0;
  local_50 = 0;
  local_4c = 0x3f800000;
  local_40 = 0x3f800000;
  local_3c = 0x3f800000;
  local_64 = local_74;
  local_58 = local_78;
  local_48 = local_68;
  local_44 = local_54;
  local_2c = local_54;
  local_28 = local_68;
  local_24 = local_74;
  local_20 = local_78;
  local_10 = in_RSI;
  local_8 = in_RDI;
  glClear(0x4000);
  glTexImage2D(0xde1,0,0x1907,*(undefined4 *)(local_8 + 0xf),*(undefined4 *)((long)local_8 + 0x7c),0
               ,local_1c,0x1401,local_10);
  glVertexPointer(2,0x1406,0x10,&local_78);
  glTexCoordPointer(2,0x1406,0x10,&local_70);
  glDrawArrays(5,0,4);
  glXSwapBuffers(local_18[1],*local_18);
  return;
}

Assistant:

void 
redraw_GL(SWindowData *window_data, const void *pixels) {
#if defined(_WIN32) || defined(WIN32)

    SWindowData_Win *window_data_ex = (SWindowData_Win *) window_data->specific;
    GLenum format = BGRA;

#elif defined(linux)

    SWindowData_X11 *window_data_ex = (SWindowData_X11 *) window_data->specific;
    GLenum format = BGRA;

#endif

    float           x, y, w, h;

    x = (float) window_data->dst_offset_x;
    y = (float) window_data->dst_offset_y;
    w = (float) window_data->dst_offset_x + window_data->dst_width;
    h = (float) window_data->dst_offset_y + window_data->dst_height;

    float vertices[] = {
        x, y,
        0, 0, 

        w, y,
        1, 0,
        
        x, h,
        0, 1,

        w, h,
        1, 1,
    };

    glClear(GL_COLOR_BUFFER_BIT);

    UseCleanUp(glBindTexture(GL_TEXTURE_2D, window_data_ex->text_id));
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, window_data->buffer_width, window_data->buffer_height, 0, format, GL_UNSIGNED_BYTE, pixels);
    //glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, window_data->buffer_width, window_data->buffer_height, GL_RGBA, GL_UNSIGNED_BYTE, pixels);

    UseCleanUp(glEnableClientState(GL_VERTEX_ARRAY));
    UseCleanUp(glEnableClientState(GL_TEXTURE_COORD_ARRAY));
    glVertexPointer(2, GL_FLOAT, 4 * sizeof(float), vertices);
    glTexCoordPointer(2, GL_FLOAT, 4 * sizeof(float), vertices + 2);

    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

    UseCleanUp(glDisableClientState(GL_TEXTURE_COORD_ARRAY));
    UseCleanUp(glDisableClientState(GL_VERTEX_ARRAY));
    UseCleanUp(glBindTexture(GL_TEXTURE_2D, 0));

#if defined(_WIN32) || defined(WIN32)
    SwapBuffers(window_data_ex->hdc);
#elif defined(linux)
    glXSwapBuffers(window_data_ex->display, window_data_ex->window);
#endif
}